

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O3

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this,TokenPool *tokens)

{
  iterator *piVar1;
  _Elt_pointer ppSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer ppSVar6;
  int *piVar7;
  int iVar8;
  pointer ppSVar9;
  fd_set *__arr;
  pointer __src;
  fd_set set;
  fd_set local_a8;
  
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  ppSVar9 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (ppSVar6 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar9; ppSVar6 = ppSVar6 + 1
      ) {
    uVar5 = (*ppSVar6)->fd_;
    if (-1 < (int)uVar5) {
      local_a8.fds_bits[uVar5 >> 6] = local_a8.fds_bits[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
      if (iVar4 <= (int)uVar5) {
        iVar4 = uVar5 + 1;
      }
    }
  }
  if (tokens != (TokenPool *)0x0) {
    iVar3 = (*tokens->_vptr_TokenPool[7])(tokens);
    iVar8 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar8 = iVar3;
    }
    local_a8.fds_bits[iVar8 >> 6] = local_a8.fds_bits[iVar8 >> 6] | 1L << ((byte)iVar3 & 0x3f);
    if (iVar4 <= iVar3) {
      iVar4 = iVar3 + 1;
    }
  }
  interrupted_ = 0;
  iVar4 = pselect(iVar4,&local_a8,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
                  (__sigset_t *)&this->old_mask_);
  if (iVar4 == -1) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      perror("ninja: pselect");
      return false;
    }
  }
  else {
    HandlePendingInterruption();
    if (interrupted_ != 0) {
      return true;
    }
    ppSVar6 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar9 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar6 != ppSVar9) {
      do {
        uVar5 = (*ppSVar6)->fd_;
        if (((int)uVar5 < 0) ||
           (((ulong)local_a8.fds_bits[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
LAB_00123f00:
          ppSVar6 = ppSVar6 + 1;
        }
        else {
          Subprocess::OnPipeReady(*ppSVar6);
          if ((*ppSVar6)->fd_ != -1) {
            ppSVar9 = (this->running_).
                      super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            goto LAB_00123f00;
          }
          ppSVar2 = (this->finished_).c.
                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (ppSVar2 ==
              (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Subprocess*,std::allocator<Subprocess*>>::_M_push_back_aux<Subprocess*const&>
                      ((deque<Subprocess*,std::allocator<Subprocess*>> *)&this->finished_,ppSVar6);
          }
          else {
            *ppSVar2 = *ppSVar6;
            piVar1 = &(this->finished_).c.
                      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          __src = ppSVar6 + 1;
          ppSVar9 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppSVar9) {
            memmove(ppSVar6,__src,(long)ppSVar9 - (long)__src);
            ppSVar9 = (this->running_).
                      super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppSVar9 = ppSVar9 + -1;
          (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppSVar9;
        }
      } while (ppSVar6 != ppSVar9);
    }
    if (tokens != (TokenPool *)0x0) {
      uVar5 = (*tokens->_vptr_TokenPool[7])(tokens);
      if ((-1 < (int)uVar5) &&
         (((ulong)local_a8.fds_bits[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        this->token_available_ = true;
      }
    }
  }
  return interrupted_ != 0;
}

Assistant:

bool SubprocessSet::DoWork(TokenPool* tokens) {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    FD_SET(fd, &set);
    if (nfds < fd+1)
      nfds = fd+1;
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    if ((fd >= 0) && FD_ISSET(fd, &set))
    token_available_ = true;
  }

  return IsInterrupted();
}